

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcApi.c
# Opt level: O3

Mvc_Cover_t * Mvc_CoverCreateTautology(Mvc_Cover_t *pCover)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar4;
  Mvc_Cube_t *pMVar5;
  byte bVar6;
  
  pCover_00 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
  pMVar4 = Mvc_CubeAlloc(pCover_00);
  uVar2 = *(uint *)&pMVar4->field_0x8;
  uVar3 = uVar2 & 0xffffff;
  bVar6 = (byte)(uVar2 >> 0x18);
  if ((ulong)uVar3 == 1) {
    pMVar4->pData[0] = 0xffffffff;
    *(uint *)&pMVar4->field_0x14 = 0xffffffff >> (bVar6 & 0x1f);
  }
  else if (uVar3 == 0) {
    pMVar4->pData[0] = 0xffffffff >> (bVar6 & 0x1f);
  }
  else {
    pMVar4->pData[uVar3] = 0xffffffff >> (bVar6 & 0x1f);
    memset(pMVar4->pData,0xff,(ulong)((uVar2 & 0xffffff) << 2));
  }
  if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
    pMVar5 = (Mvc_Cube_t *)&pCover_00->lCubes;
  }
  else {
    pMVar5 = (pCover_00->lCubes).pTail;
  }
  pMVar5->pNext = pMVar4;
  (pCover_00->lCubes).pTail = pMVar4;
  pMVar4->pNext = (Mvc_Cube_t *)0x0;
  piVar1 = &(pCover_00->lCubes).nItems;
  *piVar1 = *piVar1 + 1;
  return pCover_00;
}

Assistant:

Mvc_Cover_t * Mvc_CoverCreateTautology( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCubeNew;
    Mvc_Cover_t * pCoverNew;
    pCoverNew = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );
    pCubeNew = Mvc_CubeAlloc( pCoverNew );
    Mvc_CubeBitFill( pCubeNew );
    Mvc_CoverAddCubeTail( pCoverNew, pCubeNew );
    return pCoverNew;
}